

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O0

void __thiscall
SoundConfigTab::apiChanged<MidiEnumerator>
          (SoundConfigTab *this,MidiEnumerator *enumerator,DeviceGroup *group,int index)

{
  QLabel *pQVar1;
  bool bVar2;
  undefined1 local_38 [8];
  QSignalBlocker blocker;
  int index_local;
  DeviceGroup *group_local;
  MidiEnumerator *enumerator_local;
  SoundConfigTab *this_local;
  
  blocker._12_4_ = index;
  QSignalBlocker::QSignalBlocker((QSignalBlocker *)local_38,(QObject *)group->mDeviceCombo);
  MidiEnumerator::populate(enumerator,blocker._12_4_);
  DeviceGroup::populateDevices<MidiEnumerator>(group,enumerator);
  QComboBox::setCurrentIndex((int)group->mDeviceCombo);
  pQVar1 = group->mErrorLabel;
  bVar2 = MidiEnumerator::backendIsAvailable(enumerator,blocker._12_4_);
  (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,~bVar2 & 1);
  setDirtyFromEnumerator<MidiEnumerator>(this);
  QSignalBlocker::~QSignalBlocker((QSignalBlocker *)local_38);
  return;
}

Assistant:

void SoundConfigTab::apiChanged(Enumerator &enumerator, DeviceGroup *group, int index) {
    QSignalBlocker blocker(group->mDeviceCombo);
    enumerator.populate(index);
    group->populateDevices(enumerator);
    group->mDeviceCombo->setCurrentIndex(0); // default

    group->mErrorLabel->setVisible(!enumerator.backendIsAvailable(index));

    setDirtyFromEnumerator<Enumerator>();

}